

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_reporter_registrars.hpp
# Opt level: O2

void __thiscall
Catch::ListenerRegistrar<Catch2ApprovalListener>::ListenerRegistrar
          (ListenerRegistrar<Catch2ApprovalListener> *this,StringRef listenerName)

{
  EventListenerFactory *local_28;
  unique_ptr<Catch::EventListenerFactory> local_20;
  StringRef local_18;
  
  local_18.m_size = listenerName.m_size;
  local_18.m_start = listenerName.m_start;
  Detail::
  make_unique<Catch::ListenerRegistrar<Catch2ApprovalListener>::TypedListenerFactory,Catch::StringRef&>
            ((Detail *)&local_28,&local_18);
  local_20.m_ptr = local_28;
  local_28 = (EventListenerFactory *)0x0;
  Detail::registerListenerImpl(&local_20);
  if (local_20.m_ptr != (EventListenerFactory *)0x0) {
    (*(local_20.m_ptr)->_vptr_EventListenerFactory[1])();
  }
  if (local_28 != (EventListenerFactory *)0x0) {
    (**(code **)(*(long *)local_28 + 8))();
  }
  return;
}

Assistant:

ListenerRegistrar(StringRef listenerName) {
            registerListenerImpl( Detail::make_unique<TypedListenerFactory>(listenerName) );
        }